

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSiteNameCommand.cxx
# Opt level: O1

bool cmSiteNameCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  string *name;
  long *exp;
  bool bVar4;
  cmValue cVar5;
  long lVar6;
  string_view value;
  string host;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string siteName;
  string hostname_cmd;
  string hostRegExp;
  RegularExpression hostReg;
  string local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  long *local_2e0 [2];
  long local_2d0 [2];
  string local_2c0;
  long *local_2a0 [2];
  long local_290 [2];
  undefined1 *local_280;
  undefined8 local_278;
  undefined1 local_270;
  undefined7 uStack_26f;
  undefined1 local_260 [264];
  char *local_158;
  char *local_50;
  char *local_40;
  int local_38;
  
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar6 == 0x20) {
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
               (char (*) [9])"/usr/bsd");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[10]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
               (char (*) [10])"/usr/sbin");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
               (char (*) [9])"/usr/bin");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
               (char (*) [5])0x80c06d);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[6]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
               (char (*) [6])0x843c07);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[15]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
               (char (*) [15])"/usr/local/bin");
    cVar5 = cmMakefile::GetDefinition
                      (status->Makefile,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (cVar5.Value == (string *)0x0) {
      pcVar3 = status->Makefile;
      pcVar2 = local_260 + 0x10;
      local_260._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"HOSTNAME","");
      cVar5 = cmMakefile::GetDefinition(pcVar3,(string *)local_260);
      if ((pointer)local_260._0_8_ != pcVar2) {
        operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
      }
      paVar1 = &local_2c0.field_2;
      local_2c0._M_string_length = 0;
      local_2c0.field_2._M_local_buf[0] = '\0';
      local_2c0._M_dataplus._M_p = (pointer)paVar1;
      if (cVar5.Value == (string *)0x0) {
        cmsys::SystemTools::FindProgram((string *)local_260,"hostname",&local_2f8,false);
        std::__cxx11::string::operator=((string *)&local_2c0,(string *)local_260);
        if ((pointer)local_260._0_8_ != pcVar2) {
          operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_2c0);
      }
      local_2e0[0] = local_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"unknown","");
      value._M_str = local_2c0._M_dataplus._M_p;
      value._M_len = local_2c0._M_string_length;
      bVar4 = cmValue::IsOff(value);
      if (!bVar4) {
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        local_318._M_string_length = 0;
        local_318.field_2._M_local_buf[0] = '\0';
        cmSystemTools::RunSingleCommand
                  (&local_2c0,&local_318,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_NONE,
                   (cmDuration)0x0);
        if (local_318._M_string_length != 0) {
          local_2a0[0] = local_290;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2a0,"[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*","");
          exp = local_2a0[0];
          local_50 = (char *)0x0;
          local_40 = (char *)0x0;
          local_38 = 0;
          memset(local_260,0,0x20a);
          if (exp != (long *)0x0) {
            cmsys::RegularExpression::compile((RegularExpression *)local_260,(char *)exp);
          }
          bVar4 = cmsys::RegularExpression::find
                            ((RegularExpression *)local_260,local_318._M_dataplus._M_p,
                             (RegularExpressionMatch *)local_260);
          if (bVar4) {
            if ((char *)local_260._8_8_ == (char *)0x0) {
              local_280 = &local_270;
              local_278 = 0;
              local_270 = 0;
            }
            else {
              local_280 = &local_270;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_280,local_260._8_8_,local_158);
            }
            std::__cxx11::string::operator=((string *)&local_318,(string *)&local_280);
            if (local_280 != &local_270) {
              operator_delete(local_280,CONCAT71(uStack_26f,local_270) + 1);
            }
          }
          if (local_318._M_string_length != 0) {
            std::__cxx11::string::_M_assign((string *)local_2e0);
          }
          if (local_40 != (char *)0x0) {
            operator_delete__(local_40);
          }
          if (local_2a0[0] != local_290) {
            operator_delete(local_2a0[0],local_290[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,
                          CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                   local_318.field_2._M_local_buf[0]) + 1);
        }
      }
      pcVar3 = status->Makefile;
      name = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
      local_260._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Name of the computer/site where compile is being run","");
      cmMakefile::AddCacheDefinition
                (pcVar3,name,(string *)local_2e0,(string *)local_260,STRING,false);
      if ((pointer)local_260._0_8_ != pcVar2) {
        operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
      }
      if (local_2e0[0] != local_2d0) {
        operator_delete(local_2e0[0],local_2d0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                                 local_2c0.field_2._M_local_buf[0]) + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f8);
  }
  else {
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_260,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
  }
  return lVar6 == 0x20;
}

Assistant:

bool cmSiteNameCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() != 1) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string> paths;
  paths.emplace_back("/usr/bsd");
  paths.emplace_back("/usr/sbin");
  paths.emplace_back("/usr/bin");
  paths.emplace_back("/bin");
  paths.emplace_back("/sbin");
  paths.emplace_back("/usr/local/bin");

  cmValue cacheValue = status.GetMakefile().GetDefinition(args[0]);
  if (cacheValue) {
    return true;
  }

  cmValue temp = status.GetMakefile().GetDefinition("HOSTNAME");
  std::string hostname_cmd;
  if (temp) {
    hostname_cmd = *temp;
  } else {
    hostname_cmd = cmSystemTools::FindProgram("hostname", paths);
  }

  std::string siteName = "unknown";
#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string host;
  if (cmSystemTools::ReadRegistryValue(
        "HKEY_LOCAL_MACHINE\\System\\CurrentControlSet\\"
        "Control\\ComputerName\\ComputerName;ComputerName",
        host)) {
    siteName = host;
  }
#else
  // try to find the hostname for this computer
  if (!cmIsOff(hostname_cmd)) {
    std::string host;
    cmSystemTools::RunSingleCommand(hostname_cmd, &host, nullptr, nullptr,
                                    nullptr, cmSystemTools::OUTPUT_NONE);

    // got the hostname
    if (!host.empty()) {
      // remove any white space from the host name
      std::string hostRegExp = "[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*";
      cmsys::RegularExpression hostReg(hostRegExp.c_str());
      if (hostReg.find(host.c_str())) {
        // strip whitespace
        host = hostReg.match(1);
      }

      if (!host.empty()) {
        siteName = host;
      }
    }
  }
#endif
  status.GetMakefile().AddCacheDefinition(
    args[0], siteName, "Name of the computer/site where compile is being run",
    cmStateEnums::STRING);

  return true;
}